

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

void __thiscall
wallet::DescriptorScriptPubKeyMan::UpdateWalletDescriptor
          (DescriptorScriptPubKeyMan *this,WalletDescriptor *descriptor)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  int32_t iVar5;
  int32_t iVar6;
  bool bVar7;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock80;
  string error;
  unique_lock<std::recursive_mutex> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8._M_device = &(this->cs_desc_man).super_recursive_mutex;
  local_c8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_c8);
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  bVar7 = CanUpdateToWalletDescriptor(this,descriptor,&local_58);
  if (bVar7) {
    std::
    _Rb_tree<CPubKey,_std::pair<const_CPubKey,_int>,_std::_Select1st<std::pair<const_CPubKey,_int>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_int>_>_>
    ::clear(&(this->m_map_pubkeys)._M_t);
    std::
    _Rb_tree<CScript,_std::pair<const_CScript,_int>,_std::_Select1st<std::pair<const_CScript,_int>_>,_std::less<CScript>,_std::allocator<std::pair<const_CScript,_int>_>_>
    ::clear(&(this->m_map_script_pub_keys)._M_t);
    this->m_max_cached_index = -1;
    (this->m_wallet_descriptor).descriptor.
    super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (descriptor->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_wallet_descriptor).descriptor.
                super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(descriptor->descriptor).super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar1 = *(undefined8 *)((descriptor->id).super_base_blob<256U>.m_data._M_elems + 8);
    uVar2 = *(undefined8 *)((descriptor->id).super_base_blob<256U>.m_data._M_elems + 0x10);
    uVar3 = *(undefined8 *)((descriptor->id).super_base_blob<256U>.m_data._M_elems + 0x18);
    uVar4 = descriptor->creation_time;
    iVar5 = descriptor->range_start;
    iVar6 = descriptor->range_end;
    *(undefined8 *)(this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems =
         *(undefined8 *)(descriptor->id).super_base_blob<256U>.m_data._M_elems;
    *(undefined8 *)((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 8) =
         uVar1;
    *(undefined8 *)((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 0x10) =
         uVar2;
    *(undefined8 *)((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 0x18) =
         uVar3;
    (this->m_wallet_descriptor).creation_time = uVar4;
    (this->m_wallet_descriptor).range_start = iVar5;
    (this->m_wallet_descriptor).range_end = iVar6;
    (this->m_wallet_descriptor).next_index = descriptor->next_index;
    if (&this->m_wallet_descriptor != descriptor) {
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>,std::allocator<std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>,std::allocator<std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>,std::allocator<std::pair<unsigned_int_const,std::unordered_map<unsigned_int,CExtPubKey,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&(this->m_wallet_descriptor).cache,
                 (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)&descriptor->cache);
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&(this->m_wallet_descriptor).cache.m_parent_xpubs,
                 &(descriptor->cache).m_parent_xpubs._M_h);
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,CExtPubKey>,std::allocator<std::pair<unsigned_int_const,CExtPubKey>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&(this->m_wallet_descriptor).cache.m_last_hardened_xpubs,
                 &(descriptor->cache).m_last_hardened_xpubs._M_h);
    }
    boost::signals2::
    signal<void_(const_wallet::ScriptPubKeyMan_*,_long),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_wallet::ScriptPubKeyMan_*,_long)>,_boost::function<void_(const_boost::signals2::connection_&,_const_wallet::ScriptPubKeyMan_*,_long)>,_boost::signals2::mutex>
    ::operator()(&(this->super_ScriptPubKeyMan).NotifyFirstKeyTimeChanged,
                 &this->super_ScriptPubKeyMan,(this->m_wallet_descriptor).creation_time);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_c8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"UpdateWalletDescriptor","")
    ;
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_b8,": ");
    local_98._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar9 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == paVar9) {
      local_98.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_98._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    std::operator+(&local_78,&local_98,&local_58);
    std::runtime_error::runtime_error(this_00,(string *)&local_78);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void DescriptorScriptPubKeyMan::UpdateWalletDescriptor(WalletDescriptor& descriptor)
{
    LOCK(cs_desc_man);
    std::string error;
    if (!CanUpdateToWalletDescriptor(descriptor, error)) {
        throw std::runtime_error(std::string(__func__) + ": " + error);
    }

    m_map_pubkeys.clear();
    m_map_script_pub_keys.clear();
    m_max_cached_index = -1;
    m_wallet_descriptor = descriptor;

    NotifyFirstKeyTimeChanged(this, m_wallet_descriptor.creation_time);
}